

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

void __thiscall
mp::internal::BinaryReaderBase::ReportError
          (BinaryReaderBase *this,CStringRef format_str,ArgList *args)

{
  size_t sVar1;
  BinaryReadError *this_00;
  size_t offset;
  MemoryWriter w;
  pointer local_278;
  size_type sStack_270;
  size_t local_268;
  BasicWriter<char> local_258;
  Buffer<char> local_248;
  char local_228 [504];
  
  local_258.buffer_ = &local_248;
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0019a530;
  local_248.ptr_ = local_228;
  local_248.size_ = 0;
  local_248.capacity_ = 500;
  local_248._vptr_Buffer = (_func_int **)&PTR_grow_0019a598;
  offset = (long)(this->super_ReaderBase).token_ - (long)(this->super_ReaderBase).start_;
  local_278 = (this->super_ReaderBase).name_._M_dataplus._M_p;
  sStack_270 = (this->super_ReaderBase).name_._M_string_length;
  local_268 = offset;
  fmt::BasicWriter<char>::write(&local_258,0x177699,(void *)0x5b,(size_t)&local_278);
  fmt::BasicWriter<char>::write
            (&local_258,(int)format_str.data_,(void *)args->types_,(size_t)args->field_1);
  this_00 = (BinaryReadError *)__cxa_allocate_exception(0x40);
  sVar1 = (local_258.buffer_)->size_;
  if ((local_258.buffer_)->capacity_ < sVar1 + 1) {
    (**(local_258.buffer_)->_vptr_Buffer)();
  }
  (local_258.buffer_)->ptr_[sVar1] = '\0';
  BinaryReadError::BinaryReadError
            (this_00,&(this->super_ReaderBase).name_,offset,(CStringRef)(local_258.buffer_)->ptr_);
  __cxa_throw(this_00,&BinaryReadError::typeinfo,BinaryReadError::~BinaryReadError);
}

Assistant:

void mp::internal::BinaryReaderBase::ReportError(
    fmt::CStringRef format_str, const fmt::ArgList &args) {
  fmt::MemoryWriter w;
  std::size_t offset = token_ - start_;
  w.write("{}:offset {}: ", name_, offset);
  w.write(format_str, args);
  throw BinaryReadError(name_, offset, w.c_str());
}